

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotificationDispatcher.cpp
# Opt level: O3

void __thiscall NotificationDispatcher::Run(NotificationDispatcher *this)

{
  RingBuffer *this_00;
  uchar *puVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  byte *pbVar7;
  uint result_5;
  uint uVar8;
  ulong n;
  uint result_1;
  int iVar9;
  uint result_3;
  int iVar10;
  unsigned_long result_2;
  uint64_t timestamp;
  uint result;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  shared_ptr<Notification> notification;
  stringstream stream;
  _Any_data local_1e8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  Semaphore::acquire(&this->sem);
  if (((this->stopExecution)._M_base._M_i & 1U) == 0) {
    this_00 = &this->ring;
    do {
      uVar13 = (this->ring).dataSize;
      puVar1 = (this->ring).data._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      pbVar7 = (this->ring).read;
      lVar6 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + ((uint)*pbVar7 << ((byte)lVar6 & 0x1f));
        pbVar7 = puVar1 + (ulong)(pbVar7 + (1 - (long)puVar1)) % uVar13;
        (this->ring).read = pbVar7;
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x20);
      lVar6 = 4;
      do {
        pbVar7 = puVar1 + (ulong)(pbVar7 + (1 - (long)puVar1)) % uVar13;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      (this->ring).read = pbVar7;
      lVar6 = 0;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + ((uint)*pbVar7 << ((byte)lVar6 & 0x1f));
        pbVar7 = puVar1 + (ulong)(pbVar7 + (1 - (long)puVar1)) % uVar13;
        (this->ring).read = pbVar7;
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x20);
      uVar13 = (ulong)(iVar11 - 8);
      if (iVar9 != 0) {
        iVar11 = 0;
        do {
          uVar2 = (this->ring).dataSize;
          puVar1 = (this->ring).data._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          pbVar7 = (this->ring).read;
          lVar6 = 0;
          timestamp = 0;
          do {
            timestamp = timestamp + ((ulong)*pbVar7 << ((byte)lVar6 & 0x3f));
            pbVar7 = puVar1 + (ulong)(pbVar7 + (1 - (long)puVar1)) % uVar2;
            (this->ring).read = pbVar7;
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x40);
          lVar6 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + ((uint)*pbVar7 << ((byte)lVar6 & 0x1f));
            pbVar7 = puVar1 + (ulong)(pbVar7 + (1 - (long)puVar1)) % uVar2;
            (this->ring).read = pbVar7;
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x20);
          uVar13 = (ulong)((int)uVar13 - 0xc);
          if (iVar10 != 0) {
            iVar4 = 0;
            do {
              uVar2 = (this->ring).dataSize;
              puVar1 = (this->ring).data._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              pbVar7 = (this->ring).read;
              lVar6 = 0;
              do {
                pbVar7 = puVar1 + (ulong)(pbVar7 + (1 - (long)puVar1)) % uVar2;
                (this->ring).read = pbVar7;
                lVar6 = lVar6 + 8;
              } while (lVar6 != 0x20);
              lVar6 = 0;
              n = 0;
              do {
                uVar8 = (int)n + ((uint)*pbVar7 << ((byte)lVar6 & 0x1f));
                n = (ulong)uVar8;
                pbVar7 = puVar1 + (ulong)(pbVar7 + (1 - (long)puVar1)) % uVar2;
                (this->ring).read = pbVar7;
                lVar6 = lVar6 + 8;
              } while (lVar6 != 0x20);
              uVar12 = (int)uVar13 - 8;
              Find((NotificationDispatcher *)&local_1e8,(uint32_t)this);
              if ((Notification *)local_1e8._M_unused._0_8_ == (Notification *)0x0) {
                RingBuffer::Read(this_00,n);
LAB_0012d181:
                uVar12 = uVar12 - uVar8;
                bVar3 = true;
              }
              else {
                if (uVar8 == *(uint *)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        (local_1e8._M_unused._M_function_pointer + 0x18))->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 0xc)) {
                  Notification::Notify((Notification *)local_1e8._M_unused._0_8_,timestamp,this_00);
                  goto LAB_0012d181;
                }
                std::__cxx11::stringstream::stringstream(local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,"Notification sample size: ",0x1a);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," doesn\'t match: ",0x10);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                std::__cxx11::stringbuf::str();
                Logger::Log(2,&local_1d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p);
                }
                std::__cxx11::stringstream::~stringstream(local_1b8);
                std::ios_base::~ios_base(local_138);
                bVar3 = false;
              }
              uVar13 = (ulong)uVar12;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
              }
              if (!bVar3) goto LAB_0012d267;
              iVar4 = iVar4 + 1;
            } while (iVar4 != iVar10);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar9);
      }
LAB_0012d267:
      RingBuffer::Read(this_00,uVar13);
      Semaphore::acquire(&this->sem);
    } while (((this->stopExecution)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void NotificationDispatcher::Run()
{
    for ( ; ; ) {
        sem.acquire();
        if (stopExecution) {
            return;
        }
        auto fullLength = ring.ReadFromLittleEndian<uint32_t>();
        const auto length = ring.ReadFromLittleEndian<uint32_t>();
        (void)length;
        const auto numStamps = ring.ReadFromLittleEndian<uint32_t>();
        fullLength -= sizeof(length) + sizeof(numStamps);
        for (uint32_t stamp = 0; stamp < numStamps; ++stamp) {
            const auto timestamp = ring.ReadFromLittleEndian<uint64_t>();
            const auto numSamples = ring.ReadFromLittleEndian<uint32_t>();
            fullLength -= sizeof(timestamp) + sizeof(numSamples);
            for (uint32_t sample = 0; sample < numSamples; ++sample) {
                const auto hNotify = ring.ReadFromLittleEndian<uint32_t>();
                const auto size = ring.ReadFromLittleEndian<uint32_t>();
                fullLength -= sizeof(hNotify) + sizeof(size);
                const auto notification = Find(hNotify);
                if (notification) {
                    if (size != notification->Size()) {
                        LOG_WARN("Notification sample size: " << size << " doesn't match: " << notification->Size());
                        goto cleanup;
                    }
                    notification->Notify(timestamp, ring);
                } else {
                    ring.Read(size);
                }
                fullLength -= size;
            }
        }
cleanup:
        ring.Read(fullLength);
    }
}